

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

const_reference __thiscall
google::protobuf::RepeatedField<unsigned_int>::Get(RepeatedField<unsigned_int> *this,int index)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint *puVar6;
  string *psVar7;
  string *extraout_RAX;
  int *piVar8;
  const_reference puVar9;
  int *piVar10;
  long lVar11;
  bool is_soo;
  LongSooRep *this_00;
  bool is_soo_00;
  bool bVar12;
  LongSooRep LStack_28;
  
  this_00 = &LStack_28;
  lVar11 = (long)index;
  if (index < 0) {
    psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>(lVar11,0,"index >= 0");
  }
  else {
    psVar7 = (string *)0x0;
  }
  if (psVar7 == (string *)0x0) {
    iVar2 = internal::SooRep::size
                      (&this->soo_rep_,
                       (undefined1  [16])
                       ((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                       (undefined1  [16])0x0);
    if (index < iVar2) {
      psVar7 = (string *)0x0;
    }
    else {
      psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         (lVar11,(long)iVar2,"index < size()");
    }
    if (psVar7 == (string *)0x0) {
      puVar6 = elements(this,(undefined1  [16])
                             ((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                             (undefined1  [16])0x0);
      return puVar6 + lVar11;
    }
  }
  else {
    Get();
    psVar7 = extraout_RAX;
  }
  iVar5 = (int)psVar7;
  Get();
  uVar1 = this_00->elements_int;
  is_soo_00 = (uVar1 & 4) == 0;
  iVar3 = internal::SooRep::size((SooRep *)this_00,is_soo_00);
  iVar2 = 2;
  if ((uVar1 & 4) == 0) {
    piVar10 = &this_00->size;
  }
  else {
    iVar2 = this_00->capacity;
    piVar10 = (int *)internal::LongSooRep::elements(this_00);
  }
  bVar12 = iVar3 == iVar2;
  if (bVar12) {
    Grow((RepeatedField<unsigned_int> *)this_00,(uVar1 & 4) == 0,iVar3,iVar3 + 1);
    iVar2 = this_00->capacity;
    piVar10 = (int *)internal::LongSooRep::elements(this_00);
  }
  bVar12 = !bVar12;
  is_soo = bVar12 && is_soo_00;
  iVar3 = iVar3 + 1;
  iVar4 = internal::SooRep::size((SooRep *)this_00,is_soo);
  if ((iVar4 != iVar3) && ((this_00->elements_int & 4) != 0)) {
    internal::LongSooRep::elements(this_00);
  }
  set_size((RepeatedField<unsigned_int> *)this_00,is_soo,iVar3);
  piVar10[iVar4] = iVar5;
  if (is_soo != ((this_00->elements_int & 4) == 0)) {
    internal::protobuf_assumption_failed
              ("is_soo == final_is_soo",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
               ,0x35b);
  }
  iVar5 = internal::SooRep::size((SooRep *)this_00,is_soo);
  if (iVar3 != iVar5) {
    internal::protobuf_assumption_failed
              ("new_size == final_size",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
               ,0x35d);
  }
  if (bVar12 && is_soo_00) {
    piVar8 = &this_00->size;
  }
  else {
    piVar8 = (int *)internal::LongSooRep::elements(this_00);
  }
  if (piVar10 != piVar8) {
    internal::protobuf_assumption_failed
              ("elem == final_elements",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
               ,0x35f);
  }
  puVar9 = (const_reference)0x2;
  if (!bVar12 || !is_soo_00) {
    puVar9 = (const_reference)(ulong)(uint)this_00->capacity;
  }
  if (iVar2 != (int)puVar9) {
    internal::protobuf_assumption_failed
              ("capacity == final_capacity",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
               ,0x361);
  }
  return puVar9;
}

Assistant:

inline const Element& RepeatedField<Element>::Get(int index) const
    ABSL_ATTRIBUTE_LIFETIME_BOUND {
  ABSL_DCHECK_GE(index, 0);
  ABSL_DCHECK_LT(index, size());
  return elements(is_soo())[index];
}